

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O3

bool json::
     save_container<__gnu_cxx::__normal_iterator<obj_array_var1*,std::vector<obj_array_var1,std::allocator<obj_array_var1>>>>
               (ostream *out,
               __normal_iterator<obj_array_var1_*,_std::vector<obj_array_var1,_std::allocator<obj_array_var1>_>_>
               begin,__normal_iterator<obj_array_var1_*,_std::vector<obj_array_var1,_std::allocator<obj_array_var1>_>_>
                     end,int tabs)

{
  obj_array_var1 *poVar1;
  long lVar2;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_32,1);
  if (begin._M_current != end._M_current) {
    lVar2 = 0;
    do {
      if (lVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(out,&local_33,1);
      }
      save<obj_array_var1>(out,(obj_array_var1 *)((long)&(begin._M_current)->val1 + lVar2),tabs + 1)
      ;
      poVar1 = (obj_array_var1 *)((long)&begin._M_current[1].val1 + lVar2);
      lVar2 = lVar2 + 8;
    } while (poVar1 != end._M_current);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_31,1);
  return ((byte)out[*(long *)(*(long *)out + -0x18) + 0x20] & 5) != 0;
}

Assistant:

bool save_container(std::ostream& out, iterator begin, iterator end, int tabs) {
	out << '[';
	for (iterator i = begin; i != end; ++i) {
		if (i != begin)
			out << ',';
		save(out, *i, tabs + 1);
	}
	out << ']';
	return out.fail();
}